

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::AddContextHook(ImGuiContext *ctx,ImGuiContextHook *hook)

{
  ImVector<ImGuiContextHook> *in_RSI;
  ImGuiContextHook *in_RDI;
  ImGuiContext *g;
  
  ImVector<ImGuiContextHook>::push_back(in_RSI,in_RDI);
  return;
}

Assistant:

void ImGui::AddContextHook(ImGuiContext* ctx, const ImGuiContextHook* hook)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook->Callback != NULL);
    g.Hooks.push_back(*hook);
}